

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext *ctx,ExprBinaryOp *node)

{
  LLVMBuilderRef pLVar1;
  int iVar2;
  bool bVar3;
  LLVMValueRef pLVar4;
  LLVMBasicBlockRef pLVar5;
  LLVMBasicBlockRef pLVar6;
  LLVMBasicBlockRef pLVar7;
  LLVMBasicBlockRef pLVar8;
  TypeBase *pTVar9;
  LLVMTypeRef pLVar10;
  LLVMValueRef pLVar11;
  LLVMValueRef pLVar12;
  LLVMValueRef local_108;
  LLVMValueRef arguments_2 [2];
  LLVMValueRef arguments_1 [2];
  LLVMValueRef arguments [2];
  LLVMValueRef result;
  LLVMValueRef rhs;
  LLVMBasicBlockRef blocks_1 [2];
  LLVMValueRef values_1 [2];
  LLVMValueRef phi_1;
  LLVMValueRef rhs_2;
  LLVMBasicBlockRef exitBlock_1;
  LLVMBasicBlockRef storeZeroBlock_1;
  LLVMBasicBlockRef storeOneBlock_1;
  LLVMBasicBlockRef checkRhsBlock_1;
  LLVMBasicBlockRef blocks [2];
  LLVMValueRef values [2];
  LLVMValueRef phi;
  LLVMValueRef rhs_1;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef storeZeroBlock;
  LLVMBasicBlockRef storeOneBlock;
  LLVMBasicBlockRef checkRhsBlock;
  LLVMValueRef lhs;
  ExprBinaryOp *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar4 = CompileLlvm(ctx,node->lhs);
  if (*(int *)&(node->super_ExprBase).field_0x2c == 0x12) {
    pLVar5 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"land_check_rhs");
    pLVar6 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"land_store_1");
    pLVar7 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"land_store_0");
    pLVar8 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"land_exit");
    iVar2 = LLVMIntNE;
    pLVar1 = ctx->builder;
    pTVar9 = GetStackType(ctx,node->lhs->type);
    pLVar10 = CompileLlvmType(ctx,pTVar9);
    pLVar11 = LLVMConstInt(pLVar10,0,true);
    pLVar4 = LLVMBuildICmp(pLVar1,iVar2,pLVar4,pLVar11,"");
    LLVMBuildCondBr(ctx->builder,pLVar4,pLVar5,pLVar7);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar5);
    pLVar11 = CompileLlvm(ctx,node->rhs);
    iVar2 = LLVMIntNE;
    pLVar1 = ctx->builder;
    pTVar9 = GetStackType(ctx,node->rhs->type);
    pLVar10 = CompileLlvmType(ctx,pTVar9);
    pLVar12 = LLVMConstInt(pLVar10,0,true);
    LLVMBuildICmp(pLVar1,iVar2,pLVar11,pLVar12,"");
    LLVMBuildCondBr(ctx->builder,pLVar4,pLVar6,pLVar7);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar6);
    LLVMBuildBr(ctx->builder,pLVar8);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar7);
    LLVMBuildBr(ctx->builder,pLVar8);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar8);
    pLVar1 = ctx->builder;
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    pLVar4 = LLVMBuildPhi(pLVar1,pLVar10,"land");
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    blocks[1] = (LLVMBasicBlockRef)LLVMConstInt(pLVar10,1,true);
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    LLVMConstInt(pLVar10,0,true);
    checkRhsBlock_1 = pLVar6;
    blocks[0] = pLVar7;
    LLVMAddIncoming(pLVar4,(LLVMValueRef *)(blocks + 1),&checkRhsBlock_1,2);
    ctx_local = (LlvmCompilationContext *)CheckType(ctx,&node->super_ExprBase,pLVar4);
  }
  else if (*(int *)&(node->super_ExprBase).field_0x2c == 0x13) {
    pLVar5 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"lor_check_rhs");
    pLVar6 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"lor_store_1");
    pLVar7 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"lor_store_0");
    pLVar8 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"lor_exit");
    iVar2 = LLVMIntNE;
    pLVar1 = ctx->builder;
    pTVar9 = GetStackType(ctx,node->lhs->type);
    pLVar10 = CompileLlvmType(ctx,pTVar9);
    pLVar11 = LLVMConstInt(pLVar10,0,true);
    pLVar4 = LLVMBuildICmp(pLVar1,iVar2,pLVar4,pLVar11,"");
    LLVMBuildCondBr(ctx->builder,pLVar4,pLVar6,pLVar5);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar5);
    pLVar11 = CompileLlvm(ctx,node->rhs);
    iVar2 = LLVMIntNE;
    pLVar1 = ctx->builder;
    pTVar9 = GetStackType(ctx,node->rhs->type);
    pLVar10 = CompileLlvmType(ctx,pTVar9);
    pLVar12 = LLVMConstInt(pLVar10,0,true);
    LLVMBuildICmp(pLVar1,iVar2,pLVar11,pLVar12,"");
    LLVMBuildCondBr(ctx->builder,pLVar4,pLVar6,pLVar7);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar6);
    LLVMBuildBr(ctx->builder,pLVar8);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar7);
    LLVMBuildBr(ctx->builder,pLVar8);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar8);
    pLVar1 = ctx->builder;
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    pLVar4 = LLVMBuildPhi(pLVar1,pLVar10,"lor");
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    blocks_1[1] = (LLVMBasicBlockRef)LLVMConstInt(pLVar10,1,true);
    pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    LLVMConstInt(pLVar10,0,true);
    rhs = (LLVMValueRef)pLVar6;
    blocks_1[0] = pLVar7;
    LLVMAddIncoming(pLVar4,(LLVMValueRef *)(blocks_1 + 1),(LLVMBasicBlockRef *)&rhs,2);
    ctx_local = (LlvmCompilationContext *)CheckType(ctx,&node->super_ExprBase,pLVar4);
  }
  else {
    pLVar11 = CompileLlvm(ctx,node->rhs);
    iVar2 = LLVMIntNE;
    arguments[1] = (LLVMValueRef)0x0;
    switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
    case 1:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        arguments[1] = LLVMBuildAdd(ctx->builder,pLVar4,pLVar11,"");
      }
      else {
        arguments[1] = LLVMBuildFAdd(ctx->builder,pLVar4,pLVar11,"");
      }
      break;
    case 2:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        arguments[1] = LLVMBuildSub(ctx->builder,pLVar4,pLVar11,"");
      }
      else {
        arguments[1] = LLVMBuildFSub(ctx->builder,pLVar4,pLVar11,"");
      }
      break;
    case 3:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        arguments[1] = LLVMBuildMul(ctx->builder,pLVar4,pLVar11,"");
      }
      else {
        arguments[1] = LLVMBuildFMul(ctx->builder,pLVar4,pLVar11,"");
      }
      break;
    case 4:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        arguments[1] = LLVMBuildSDiv(ctx->builder,pLVar4,pLVar11,"");
      }
      else {
        arguments[1] = LLVMBuildFDiv(ctx->builder,pLVar4,pLVar11,"");
      }
      break;
    case 5:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        arguments[1] = LLVMBuildSRem(ctx->builder,pLVar4,pLVar11,"");
      }
      else {
        arguments[1] = LLVMBuildFRem(ctx->builder,pLVar4,pLVar11,"");
      }
      break;
    case 6:
      pTVar9 = GetStackType(ctx,(node->super_ExprBase).type);
      if ((pTVar9 == ctx->ctx->typeInt) ||
         (bVar3 = isType<TypeEnum>((node->super_ExprBase).type), bVar3)) {
        pLVar1 = ctx->builder;
        arguments_1[1] = pLVar4;
        pLVar4 = LLVMGetNamedFunction(ctx->module,"__llvmPowInt");
        arguments[1] = LLVMBuildCall(pLVar1,pLVar4,arguments_1 + 1,2,"");
      }
      else {
        pTVar9 = GetStackType(ctx,(node->super_ExprBase).type);
        if (pTVar9 == ctx->ctx->typeLong) {
          pLVar1 = ctx->builder;
          arguments_2[1] = pLVar4;
          arguments_1[0] = pLVar11;
          pLVar4 = LLVMGetNamedFunction(ctx->module,"__llvmPowLong");
          arguments[1] = LLVMBuildCall(pLVar1,pLVar4,arguments_2 + 1,2,"");
        }
        else {
          pTVar9 = GetStackType(ctx,(node->super_ExprBase).type);
          if (pTVar9 != ctx->ctx->typeDouble) {
            __assert_fail("!\"unknown operand type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                          ,0x4e8,
                          "LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &, ExprBinaryOp *)"
                         );
          }
          pLVar1 = ctx->builder;
          local_108 = pLVar4;
          arguments_2[0] = pLVar11;
          pLVar4 = LLVMGetNamedFunction(ctx->module,"__llvmPowDouble");
          arguments[1] = LLVMBuildCall(pLVar1,pLVar4,&local_108,2,"");
        }
      }
      break;
    case 7:
      arguments[1] = LLVMBuildShl(ctx->builder,pLVar4,pLVar11,"");
      break;
    case 8:
      arguments[1] = LLVMBuildAShr(ctx->builder,pLVar4,pLVar11,"");
      break;
    case 9:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntSLT,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      else {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildFCmp(ctx->builder,LLVMRealULT,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      break;
    case 10:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntSLE,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      else {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildFCmp(ctx->builder,LLVMRealULE,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      break;
    case 0xb:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntSGT,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      else {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildFCmp(ctx->builder,LLVMRealUGT,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      break;
    case 0xc:
      bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
      if ((bVar3) || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntSGE,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      else {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildFCmp(ctx->builder,LLVMRealUGE,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      break;
    case 0xd:
      bVar3 = isType<TypeRef>(node->lhs->type);
      if (((bVar3) || (bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type), bVar3))
         || ((bVar3 = isType<TypeEnum>(node->lhs->type), bVar3 ||
             (node->lhs->type == ctx->ctx->typeTypeID)))) {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntEQ,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      else {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildFCmp(ctx->builder,LLVMRealUEQ,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      break;
    case 0xe:
      bVar3 = isType<TypeRef>(node->lhs->type);
      if ((((bVar3) || (bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type), bVar3))
          || (bVar3 = isType<TypeEnum>(node->lhs->type), bVar3)) ||
         (node->lhs->type == ctx->ctx->typeTypeID)) {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntNE,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      else {
        pLVar1 = ctx->builder;
        pLVar4 = LLVMBuildFCmp(ctx->builder,LLVMRealUNE,pLVar4,pLVar11,"");
        pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
      }
      break;
    case 0xf:
      arguments[1] = LLVMBuildAnd(ctx->builder,pLVar4,pLVar11,"");
      break;
    case 0x10:
      arguments[1] = LLVMBuildOr(ctx->builder,pLVar4,pLVar11,"");
      break;
    case 0x11:
      arguments[1] = LLVMBuildXor(ctx->builder,pLVar4,pLVar11,"");
      break;
    default:
      break;
    case 0x14:
      pLVar1 = ctx->builder;
      pTVar9 = GetStackType(ctx,node->lhs->type);
      pLVar10 = CompileLlvmType(ctx,pTVar9);
      pLVar12 = LLVMConstInt(pLVar10,0,true);
      pLVar4 = LLVMBuildICmp(pLVar1,iVar2,pLVar4,pLVar12,"");
      iVar2 = LLVMIntNE;
      pLVar1 = ctx->builder;
      pTVar9 = GetStackType(ctx,node->rhs->type);
      pLVar10 = CompileLlvmType(ctx,pTVar9);
      pLVar12 = LLVMConstInt(pLVar10,0,true);
      pLVar11 = LLVMBuildICmp(pLVar1,iVar2,pLVar11,pLVar12,"");
      pLVar1 = ctx->builder;
      pLVar4 = LLVMBuildICmp(ctx->builder,LLVMIntNE,pLVar4,pLVar11,"");
      pLVar10 = CompileLlvmType(ctx,ctx->ctx->typeInt);
      arguments[1] = LLVMBuildZExt(pLVar1,pLVar4,pLVar10,"");
    }
    if (arguments[1] == (LLVMValueRef)0x0) {
      __assert_fail("result",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x529,
                    "LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &, ExprBinaryOp *)");
    }
    ctx_local = (LlvmCompilationContext *)CheckType(ctx,&node->super_ExprBase,arguments[1]);
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &ctx, ExprBinaryOp *node)
{
	LLVMValueRef lhs = CompileLlvm(ctx, node->lhs);

	if(node->op == SYN_BINARY_OP_LOGICAL_AND)
	{
		LLVMBasicBlockRef checkRhsBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_check_rhs");
		LLVMBasicBlockRef storeOneBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_store_1");
		LLVMBasicBlockRef storeZeroBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_store_0");
		LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_exit");

		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, checkRhsBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, checkRhsBlock);

		LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeOneBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeZeroBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

		LLVMValueRef phi = LLVMBuildPhi(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "land");

		LLVMValueRef values[] = { LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true) };
		LLVMBasicBlockRef blocks[] = { storeOneBlock, storeZeroBlock };

		LLVMAddIncoming(phi, values, blocks, 2);

		return CheckType(ctx, node, phi);
	}

	if(node->op == SYN_BINARY_OP_LOGICAL_OR)
	{
		LLVMBasicBlockRef checkRhsBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_check_rhs");
		LLVMBasicBlockRef storeOneBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_store_1");
		LLVMBasicBlockRef storeZeroBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_store_0");
		LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_exit");

		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, checkRhsBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, checkRhsBlock);

		LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeOneBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeZeroBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

		LLVMValueRef phi = LLVMBuildPhi(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "lor");

		LLVMValueRef values[] = { LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true) };
		LLVMBasicBlockRef blocks[] = { storeOneBlock, storeZeroBlock };

		LLVMAddIncoming(phi, values, blocks, 2);

		return CheckType(ctx, node, phi);
	}

	LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

	LLVMValueRef result = NULL;

	switch(node->op)
	{
	case SYN_BINARY_OP_ADD:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildAdd(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFAdd(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_SUB:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSub(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFSub(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_MUL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildMul(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFMul(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_DIV:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSDiv(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFDiv(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_MOD:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSRem(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFRem(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_POW:
		if(GetStackType(ctx, node->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->type))
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowInt"), arguments, 2, "");
		}
		else if(GetStackType(ctx, node->type) == ctx.ctx.typeLong)
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowLong"), arguments, 2, "");
		}
		else if(GetStackType(ctx, node->type) == ctx.ctx.typeDouble)
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowDouble"), arguments, 2, "");
		}
		else
		{
			assert(!"unknown operand type");
		}
		break;
	case SYN_BINARY_OP_SHL:
		result = LLVMBuildShl(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_SHR:
		result = LLVMBuildAShr(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_LESS:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSLT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealULT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_LESS_EQUAL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSLE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealULE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_GREATER:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSGT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUGT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_GREATER_EQUAL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSGE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUGE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_EQUAL:
		if(isType<TypeRef>(node->lhs->type) || ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type) || node->lhs->type == ctx.ctx.typeTypeID)
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUEQ, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_NOT_EQUAL:
		if(isType<TypeRef>(node->lhs->type) || ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type) || node->lhs->type == ctx.ctx.typeTypeID)
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_BIT_AND:
		result = LLVMBuildAnd(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_BIT_OR:
		result = LLVMBuildOr(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_BIT_XOR:
		result = LLVMBuildXor(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_LOGICAL_XOR:
		// (lhs != 0) != (rhs != 0)
		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");
		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	default:
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}